

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cc
# Opt level: O2

Vector2 AVO::anon_unknown_0::tangentPoint(Vector2 *p,float r)

{
  float fVar1;
  float fVar2;
  Vector2 VVar3;
  Vector2 local_10;
  
  fVar1 = absSq(p);
  fVar2 = fVar1 - r * r;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  Vector2::Vector2(&local_10,fVar2 * p->x_ - p->y_ * r,r * p->x_ + p->y_ * fVar2);
  VVar3 = Vector2::operator*(&local_10,fVar2 / fVar1);
  return VVar3;
}

Assistant:

Vector2 tangentPoint(const Vector2 &p, float r) {
  const float pLengthSq = absSq(p);
  const float l = std::sqrt(pLengthSq - r * r);
  return Vector2(l * p.x_ - r * p.y_, r * p.x_ + l * p.y_) * (l / pLengthSq);
}